

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Point2f __thiscall
pbrt::WindowedPiecewiseConstant2D::Sample
          (WindowedPiecewiseConstant2D *this,Point2f *u,Bounds2f *b,Float *pdf)

{
  float fVar1;
  undefined1 auVar2 [16];
  anon_class_24_3_6b4c7fa8 func;
  anon_class_24_3_3815fa30 func_00;
  int n;
  Float FVar3;
  Point2f PVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  Point2f p;
  Bounds2f by;
  Float sumby;
  Float sumb;
  Tuple2<pbrt::Point2,_float> local_80;
  Bounds2f local_78;
  Float local_68;
  Float local_64;
  WindowedPiecewiseConstant2D *local_60;
  Bounds2f *pBStack_58;
  Float *local_50;
  WindowedPiecewiseConstant2D *local_48;
  Bounds2f *pBStack_40;
  Float *local_38;
  
  FVar3 = SummedAreaTable::Sum(&this->sat,b);
  if ((FVar3 != 0.0) || (NAN(FVar3))) {
    local_64 = SummedAreaTable::Sum(&this->sat,b);
    local_38 = &local_64;
    local_80.x = 0.0;
    local_80.y = 0.0;
    n = (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
        (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    func.b = b;
    func.this = this;
    func.sumb = local_38;
    local_48 = this;
    pBStack_40 = b;
    FVar3 = sample<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_1_>
                      (func,(u->super_Tuple2<pbrt::Point2,_float>).x,
                       (b->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                       (b->pMax).super_Tuple2<pbrt::Point2,_float>.x,n);
    local_80.x = FVar3;
    fVar6 = (float)n;
    fVar1 = FVar3 * fVar6;
    auVar2 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
    auVar7._0_4_ = auVar2._0_4_ / fVar6;
    auVar7._4_12_ = auVar2._4_12_;
    auVar2 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),10);
    auVar5._0_4_ = auVar2._0_4_ / fVar6;
    auVar5._4_12_ = auVar2._4_12_;
    auVar2 = vinsertps_avx(auVar5,ZEXT416((uint)(b->pMax).super_Tuple2<pbrt::Point2,_float>.y),0x10)
    ;
    auVar5 = vinsertps_avx(auVar7,ZEXT416((uint)(b->pMin).super_Tuple2<pbrt::Point2,_float>.y),0x10)
    ;
    auVar7 = vminps_avx(auVar2,auVar5);
    auVar2 = vmaxps_avx(auVar2,auVar5);
    local_78 = (Bounds2f)vmovlhps_avx(auVar7,auVar2);
    if ((local_78.pMin.super_Tuple2<pbrt::Point2,_float>.x ==
         local_78.pMax.super_Tuple2<pbrt::Point2,_float>.x) &&
       (!NAN(local_78.pMin.super_Tuple2<pbrt::Point2,_float>.x) &&
        !NAN(local_78.pMax.super_Tuple2<pbrt::Point2,_float>.x))) {
      local_78.pMax.super_Tuple2<pbrt::Point2,_float>.x =
           1.0 / fVar6 + local_78.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    }
    FVar3 = SummedAreaTable::Sum(&this->sat,&local_78);
    if ((FVar3 != 0.0) || (NAN(FVar3))) {
      local_68 = SummedAreaTable::Sum(&this->sat,&local_78);
      local_50 = &local_68;
      func_00.by = &local_78;
      func_00.this = this;
      func_00.sumby = local_50;
      local_60 = this;
      pBStack_58 = &local_78;
      FVar3 = sample<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_2_>
                        (func_00,(u->super_Tuple2<pbrt::Point2,_float>).y,
                         (b->pMin).super_Tuple2<pbrt::Point2,_float>.y,
                         (b->pMax).super_Tuple2<pbrt::Point2,_float>.y,
                         (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                         (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      local_80.y = FVar3;
      FVar3 = PDF(this,(Point2f *)&local_80,b);
      *pdf = FVar3;
      return (Point2f)local_80;
    }
  }
  *pdf = 0.0;
  PVar4.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  PVar4.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  return (Point2f)PVar4.super_Tuple2<pbrt::Point2,_float>;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, const Bounds2f &b, Float *pdf) const {
        // Handle zero-valued function for windowed sampling
        if (sat.Sum(b) == 0) {
            *pdf = 0;
            return {};
        }

        // Sample marginal windowed function in the first dimension
        Float sumb = sat.Sum(b);
        auto Px = [&, this](Float x) -> Float {
            Bounds2f bx = b;
            bx.pMax.x = x;
            return sat.Sum(bx) / sumb;
        };
        Point2f p;
        int nx = func.xSize();
        p.x = sample(Px, u[0], b.pMin.x, b.pMax.x, nx);

        // Sample conditional windowed function in the second dimension
        Bounds2f by(Point2f(std::floor(p.x * nx) / nx, b.pMin.y),
                    Point2f(std::ceil(p.x * nx) / nx, b.pMax.y));
        if (by.pMin.x == by.pMax.x)
            by.pMax.x += 1.f / nx;
        if (sat.Sum(by) == 0) {
            // This can happen when we're provided a really narrow initial
            // bounding box
            *pdf = 0;
            return {};
        }
        Float sumby = sat.Sum(by);
        auto Py = [&, this](Float y) -> Float {
            Bounds2f byy = by;
            byy.pMax.y = y;
            return sat.Sum(byy) / sumby;
        };
        p.y = sample(Py, u[1], b.pMin.y, b.pMax.y, func.ySize());

        // Compute PDF and return point sampled from windowed function
        *pdf = PDF(p, b);
        return p;
    }